

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

uint capnp::anon_unknown_1::CapnpcCppMain::typeSizeBits(Which whichType)

{
  Fault local_18;
  Fault f;
  Which whichType_local;
  
  f.exception._2_2_ = whichType;
  switch(whichType) {
  case VOID:
  case TEXT:
  case DATA:
  case LIST:
  case STRUCT:
  case INTERFACE:
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
               ,0x39b,FAILED,(char *)0x0,"\"Should only be called for data types.\"",
               (char (*) [38])"Should only be called for data types.");
    kj::_::Debug::Fault::fatal(&local_18);
  case BOOL:
    f.exception._4_4_ = 1;
    break;
  case INT8:
    f.exception._4_4_ = 8;
    break;
  case INT16:
    f.exception._4_4_ = 0x10;
    break;
  case INT32:
    f.exception._4_4_ = 0x20;
    break;
  case INT64:
    f.exception._4_4_ = 0x40;
    break;
  case UINT8:
    f.exception._4_4_ = 8;
    break;
  case UINT16:
    f.exception._4_4_ = 0x10;
    break;
  case UINT32:
    f.exception._4_4_ = 0x20;
    break;
  case UINT64:
    f.exception._4_4_ = 0x40;
    break;
  case FLOAT32:
    f.exception._4_4_ = 0x20;
    break;
  case FLOAT64:
    f.exception._4_4_ = 0x40;
    break;
  case ENUM:
    f.exception._4_4_ = 0x10;
    break;
  default:
    kj::_::unreachable();
  }
  return f.exception._4_4_;
}

Assistant:

static uint typeSizeBits(schema::Type::Which whichType) {
    switch (whichType) {
      case schema::Type::BOOL: return 1;
      case schema::Type::INT8: return 8;
      case schema::Type::INT16: return 16;
      case schema::Type::INT32: return 32;
      case schema::Type::INT64: return 64;
      case schema::Type::UINT8: return 8;
      case schema::Type::UINT16: return 16;
      case schema::Type::UINT32: return 32;
      case schema::Type::UINT64: return 64;
      case schema::Type::FLOAT32: return 32;
      case schema::Type::FLOAT64: return 64;
      case schema::Type::ENUM: return 16;

      case schema::Type::VOID:
      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::LIST:
      case schema::Type::STRUCT:
      case schema::Type::INTERFACE:
      case schema::Type::ANY_POINTER:
        KJ_FAIL_REQUIRE("Should only be called for data types.");
    }
    KJ_UNREACHABLE;
  }